

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4afdb9::ElaboratedTypeSpefType::printLeft
          (ElaboratedTypeSpefType *this,OutputStream *S)

{
  OutputStream::operator+=(S,this->Kind);
  OutputStream::operator+=(S,' ');
  Node::print(this->Child,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += Kind;
    S += ' ';
    Child->print(S);
  }